

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t rar5_read_data_skip(archive_read *a)

{
  void *pvVar1;
  long request;
  wchar_t wVar2;
  int64_t iVar3;
  
  pvVar1 = a->format->data;
  if (((*(byte *)((long)pvVar1 + 0x2c) & 1) == 0) || ((*(byte *)((long)pvVar1 + 0x38) & 0x10) != 0))
  {
    request = *(long *)((long)pvVar1 + 0x4ba8);
    iVar3 = __archive_read_consume(a,request);
    wVar2 = L'\xffffffe2';
    if (iVar3 == request) {
      *(undefined8 *)((long)pvVar1 + 0x4ba8) = 0;
LAB_0012c46c:
      wVar2 = L'\0';
    }
  }
  else {
    do {
      if (*(long *)((long)pvVar1 + 0x4ba8) < 1) goto LAB_0012c46c;
      *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + 1;
      wVar2 = rar5_read_data(a,(void **)0x0,(size_t *)0x0,(int64_t *)0x0);
      *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + -1;
    } while ((L'\xffffffff' < wVar2) && (wVar2 != L'\x01'));
  }
  return wVar2;
}

Assistant:

static int rar5_read_data_skip(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	if(rar->main.solid && (rar->cstate.data_encrypted == 0)) {
		/* In solid archives, instead of skipping the data, we need to
		 * extract it, and dispose the result. The side effect of this
		 * operation will be setting up the initial window buffer state
		 * needed to be able to extract the selected file. Note that
		 * this is only possible when data withing this solid block is
		 * not encrypted, in which case we'll skip and fail if the user
		 * tries to read data. */

		int ret;

		/* Make sure to process all blocks in the compressed stream. */
		while(rar->file.bytes_remaining > 0) {
			/* Setting the "skip mode" will allow us to skip
			 * checksum checks during data skipping. Checking the
			 * checksum of skipped data isn't really necessary and
			 * it's only slowing things down.
			 *
			 * This is incremented instead of setting to 1 because
			 * this data skipping function can be called
			 * recursively. */
			rar->skip_mode++;

			/* We're disposing 1 block of data, so we use triple
			 * NULLs in arguments. */
			ret = rar5_read_data(a, NULL, NULL, NULL);

			/* Turn off "skip mode". */
			rar->skip_mode--;

			if(ret < 0 || ret == ARCHIVE_EOF) {
				/* Propagate any potential error conditions
				 * to the caller. */
				return ret;
			}
		}
	} else {
		/* In standard archives, we can just jump over the compressed
		 * stream. Each file in non-solid archives starts from an empty
		 * window buffer. */

		if(ARCHIVE_OK != consume(a, rar->file.bytes_remaining)) {
			return ARCHIVE_FATAL;
		}

		rar->file.bytes_remaining = 0;
	}

	return ARCHIVE_OK;
}